

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWInstanceKinematicsScene.cpp
# Opt level: O0

void __thiscall
COLLADAFW::InstanceKinematicsScene::InstanceKinematicsScene
          (InstanceKinematicsScene *this,InstanceKinematicsScene *pre)

{
  Array<COLLADAFW::InstanceKinematicsScene::NodeLinkBinding> *in_RSI;
  undefined8 *in_RDI;
  InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008> *in_stack_ffffffffffffffd8;
  InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008> *in_stack_ffffffffffffffe0;
  Array<COLLADAFW::InstanceKinematicsScene::NodeLinkBinding> *in_stack_ffffffffffffffe8;
  
  InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>::InstanceBase
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *in_RDI = &PTR__InstanceKinematicsScene_00e6c660;
  Array<COLLADAFW::UniqueId>::Array((Array<COLLADAFW::UniqueId> *)(in_RDI + 0xb),3);
  Array<COLLADAFW::InstanceKinematicsScene::NodeLinkBinding>::Array
            ((Array<COLLADAFW::InstanceKinematicsScene::NodeLinkBinding> *)(in_RDI + 0x10),3);
  in_RDI[0x15] = in_RSI[4].mData;
  Array<COLLADAFW::UniqueId>::cloneArray
            ((Array<COLLADAFW::UniqueId> *)in_RSI,
             (Array<COLLADAFW::UniqueId> *)in_stack_ffffffffffffffe8);
  Array<COLLADAFW::InstanceKinematicsScene::NodeLinkBinding>::cloneArray
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

InstanceKinematicsScene::InstanceKinematicsScene( const InstanceKinematicsScene& pre )
		: InstanceBase<COLLADA_TYPE::INSTANCE_KINEMATICS_SCENE>(pre)
		, mBoundNodes(UniqueIdArray::OWNER)
		, mNodeLinkBindings(NodeLinkBindingArray::OWNER)
		, mFileId(pre.mFileId)
	{
		pre.mBoundNodes.cloneArray(mBoundNodes);
		pre.mNodeLinkBindings.cloneArray(mNodeLinkBindings);
	}